

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  pointer pMVar10;
  pointer pMVar11;
  int *piVar12;
  void *pvVar13;
  Allocator *pAVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  long lVar32;
  long lVar33;
  Convolution_x86 *pCVar34;
  bool bVar35;
  bool bVar36;
  byte bVar37;
  int iVar38;
  Layer *pLVar39;
  _func_int **pp_Var40;
  byte bVar41;
  byte bVar42;
  undefined4 uVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  Option *pOVar50;
  long lVar51;
  long lVar52;
  int k;
  ulong uVar53;
  undefined1 (*pauVar54) [16];
  uint uVar55;
  Mat *pMVar56;
  undefined1 (*pauVar57) [16];
  undefined1 (*pauVar58) [16];
  _func_int **pp_Var59;
  long lVar60;
  ulong uVar61;
  _func_int **pp_Var62;
  _func_int **pp_Var63;
  uint uVar64;
  long lVar65;
  int iVar66;
  int iVar67;
  ulong uVar68;
  long lVar69;
  long lVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auStackY_238 [8];
  undefined8 uStackY_230;
  Convolution_x86 *local_218;
  undefined8 local_210;
  ulong local_208;
  uint local_1fc;
  ParamDict pd;
  Allocator *local_1d8;
  int iStack_1d0;
  int iStack_1cc;
  undefined8 uStack_1c8;
  int local_1c0 [2];
  size_t local_1b8;
  void *local_1b0;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  size_t sStack_1a0;
  int iStack_198;
  Allocator *local_190;
  undefined1 local_188 [16];
  int local_178;
  size_t local_170;
  _func_int **local_168;
  ulong local_160;
  ulong local_158;
  undefined8 local_150;
  ParamDict pd_5;
  size_t local_138;
  Allocator *local_128;
  int iStack_11c;
  undefined1 local_120 [16];
  int local_110;
  size_t local_108;
  long local_f0;
  int TILE_M;
  Mat *local_d8;
  int local_cc;
  uint local_c8;
  int TILE_K;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  local_218 = this;
  local_210 = opt;
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar39 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar39->_vptr_Layer[2])(pLVar39);
    break;
  case 2:
    pLVar39 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(local_218->super_Convolution).activation_params.data);
    (*pLVar39->_vptr_Layer[2])(pLVar39);
    break;
  case 3:
    pLVar39 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    this = local_218;
    ParamDict::set(&pd,0,*(local_218->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar39->_vptr_Layer[2])(pLVar39);
    goto LAB_00151bf3;
  case 4:
    pLVar39 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar39->_vptr_Layer[2])(pLVar39);
    break;
  case 5:
    pLVar39 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar39->_vptr_Layer[2])(pLVar39);
    break;
  case 6:
    pLVar39 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    this = local_218;
    ParamDict::set(&pd,0,*(local_218->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar39->_vptr_Layer[2])(pLVar39);
LAB_00151bf3:
    ParamDict::~ParamDict(&pd);
    goto LAB_00151c02;
  default:
    pLVar39 = (Layer *)0x0;
    goto LAB_00151c02;
  }
  ParamDict::~ParamDict(&pd);
  this = local_218;
LAB_00151c02:
  pOVar50 = local_210;
  if (pLVar39 != (Layer *)0x0) {
    (*pLVar39->_vptr_Layer[4])(pLVar39);
  }
  this->activation = pLVar39;
  this->nT = pOVar50->num_threads;
  if ((pOVar50->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)
     ) {
    create_pipeline_int8_x86(this,pOVar50);
    return 0;
  }
  uVar9._0_4_ = (this->super_Convolution).kernel_w;
  uVar9._4_4_ = (this->super_Convolution).kernel_h;
  uVar61 = (long)(this->super_Convolution).weight_data_size /
           (long)(int)(uVar9._4_4_ * (undefined4)uVar9);
  uVar55 = (this->super_Convolution).num_output;
  uVar61 = (long)((ulong)(uint)((int)uVar61 >> 0x1f) << 0x20 | uVar61 & 0xffffffff) /
           (long)(int)uVar55;
  bVar41 = (undefined4)uVar9 != uVar9._4_4_ | pOVar50->use_packing_layout;
  uVar48 = CONCAT71((int7)((ulong)uVar9 >> 8),bVar41);
  if (bVar41 == 0) {
    uVar64 = (this->super_Convolution).dilation_w;
    uVar48 = (ulong)uVar64;
    if ((((uVar64 != 1) && ((this->super_Convolution).dilation_h == uVar64)) &&
        ((this->super_Convolution).stride_w == 1)) && ((this->super_Convolution).stride_h == 1)) {
      pLVar39 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar39;
      ParamDict::ParamDict(&pd_5);
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      ParamDict::set(&pd_5,2,1);
      ParamDict::set(&pd_5,0xc,1);
      ParamDict::set(&pd_5,3,1);
      ParamDict::set(&pd_5,0xd,1);
      ParamDict::set(&pd_5,4,0);
      ParamDict::set(&pd_5,0xe,0);
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_1b8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_1d8 = (Allocator *)0x0;
        iStack_1d0 = 0;
        iStack_1cc = 0;
        uStack_1c8._0_4_ = 0;
        uStack_1c8._4_4_ = 0;
        local_1c0[0] = 0;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar12 = (this->super_Convolution).weight_data.refcount;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar12 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar12,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar12 >> 0x20);
          local_1d8 = (this->super_Convolution).weight_data.allocator;
          uVar30 = (this->super_Convolution).weight_data.dims;
          uVar31 = (this->super_Convolution).weight_data.w;
          uStack_1c8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_1c8._4_4_ = (this->super_Convolution).weight_data.d;
          local_1c0[0] = (this->super_Convolution).weight_data.c;
          local_1b8 = (this->super_Convolution).weight_data.cstep;
          iStack_1d0 = uVar30;
          iStack_1cc = uVar31;
        }
        pLVar39 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar39->_vptr_Layer[3])(pLVar39,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (local_1d8 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_1d8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        lVar51 = 0x40;
        do {
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar51) = 0;
          *(undefined1 (*) [16])(auStackY_238 + lVar51) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&uStackY_230 + lVar51 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_218 + lVar51) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_210 + lVar51 + 4) = (undefined1  [16])0x0;
          lVar51 = lVar51 + 0x48;
        } while (lVar51 != 0xd0);
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar12 = (this->super_Convolution).weight_data.refcount;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (local_1d8 == (Allocator *)0x0) {
                if (pd._vptr_ParamDict != (_func_int **)0x0) {
                  free(pd._vptr_ParamDict);
                }
              }
              else {
                (*local_1d8->_vptr_Allocator[3])();
              }
            }
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar12 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar12,0);
          pd.d._4_4_ = (undefined4)((ulong)piVar12 >> 0x20);
          local_1d8 = (this->super_Convolution).weight_data.allocator;
          uVar28 = (this->super_Convolution).weight_data.dims;
          uVar29 = (this->super_Convolution).weight_data.w;
          uStack_1c8._0_4_ = (this->super_Convolution).weight_data.h;
          uStack_1c8._4_4_ = (this->super_Convolution).weight_data.d;
          local_1c0[0] = (this->super_Convolution).weight_data.c;
          local_1b8 = (this->super_Convolution).weight_data.cstep;
          iStack_1d0 = uVar28;
          iStack_1cc = uVar29;
        }
        if ((Mat *)&local_1b0 != &(this->super_Convolution).bias_data) {
          piVar12 = (this->super_Convolution).bias_data.refcount;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
          piVar12 = (int *)CONCAT44(uStack_1a4,uStack_1a8);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              if (local_190 == (Allocator *)0x0) {
                if (local_1b0 != (void *)0x0) {
                  free(local_1b0);
                }
              }
              else {
                (*local_190->_vptr_Allocator[3])();
              }
            }
          }
          local_1b0 = (this->super_Convolution).bias_data.data;
          piVar12 = (this->super_Convolution).bias_data.refcount;
          uStack_1a8 = SUB84(piVar12,0);
          uStack_1a4 = (undefined4)((ulong)piVar12 >> 0x20);
          sStack_1a0 = (this->super_Convolution).bias_data.elemsize;
          iStack_198 = (this->super_Convolution).bias_data.elempack;
          local_190 = (this->super_Convolution).bias_data.allocator;
          local_188._0_4_ = (this->super_Convolution).bias_data.dims;
          local_188._4_4_ = (this->super_Convolution).bias_data.w;
          local_188._8_4_ = (this->super_Convolution).bias_data.h;
          local_188._12_4_ = (this->super_Convolution).bias_data.d;
          local_178 = (this->super_Convolution).bias_data.c;
          local_170 = (this->super_Convolution).bias_data.cstep;
        }
        pLVar39 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar39->_vptr_Layer[3])(pLVar39,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar51 = 0x48;
        do {
          piVar12 = *(int **)((long)&pd.d + lVar51);
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + -1;
            UNLOCK();
            if (*piVar12 == 0) {
              pvVar13 = *(void **)((long)&pd._vptr_ParamDict + lVar51);
              if (*(long **)((long)&local_1d8 + lVar51) == (long *)0x0) {
                if (pvVar13 != (void *)0x0) {
                  free(pvVar13);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_1d8 + lVar51) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1b8 + lVar51) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar51 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar51) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&iStack_1d0 + lVar51) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_1c0 + lVar51) = 0;
          lVar51 = lVar51 + -0x48;
        } while (lVar51 != -0x48);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,local_210);
      if (local_210->lightmode == true) {
        piVar12 = (this->super_Convolution).weight_data.refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            pvVar13 = (this->super_Convolution).weight_data.data;
            pAVar14 = (this->super_Convolution).weight_data.allocator;
            if (pAVar14 == (Allocator *)0x0) {
              if (pvVar13 != (void *)0x0) {
                free(pvVar13);
              }
            }
            else {
              (*pAVar14->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  uVar43 = (undefined4)uVar48;
  iVar49 = 1;
  iVar67 = 1;
  if (pOVar50->use_packing_layout != false) {
    iVar49 = (uint)((uVar61 & 3) == 0) * 3 + 1;
    iVar67 = (uint)((uVar55 & 3) == 0) * 3 + 1;
  }
  bVar41 = local_210->use_winograd23_convolution;
  iVar66 = (int)uVar61;
  if ((((bool)bVar41 == false) && (local_210->use_winograd43_convolution == false)) &&
     (local_210->use_winograd63_convolution != true)) {
    bVar35 = false;
  }
  else {
    uVar43 = (undefined4)CONCAT71((int7)(uVar48 >> 8),8 < iVar66);
    bVar35 = 8 < (int)uVar55 || 8 < iVar66;
  }
  auVar71._0_4_ = -(uint)((undefined4)uVar9 == 3);
  auVar71._4_4_ = -(uint)(uVar9._4_4_ == 3);
  auVar71._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
  auVar71._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
  iVar44 = movmskps(uVar43,auVar71);
  if (((iVar44 != 0xf) || ((this->super_Convolution).stride_w != 1)) ||
     (((this->super_Convolution).stride_h != 1 ||
      ((local_210->use_winograd_convolution == false || (!bVar35)))))) {
    iVar38 = get_cpu_level2_cache_size();
    pOVar50 = local_210;
    uVar55 = (this->super_Convolution).num_output;
    local_208 = (ulong)uVar55;
    iVar44 = (this->super_Convolution).kernel_w;
    iVar6 = (this->super_Convolution).kernel_h;
    iVar7 = (this->super_Convolution).dilation_w;
    iVar8 = (this->super_Convolution).dilation_h;
    iVar4 = (this->super_Convolution).stride_w;
    iVar5 = (this->super_Convolution).stride_h;
    if (((local_210->use_sgemm_convolution != true) ||
        ((int)(uVar55 * iVar44 * iVar6 * iVar7 * iVar8 * iVar4 * iVar5 * iVar66 * 8) <= iVar38 &&
         (iVar66 < 0x11 && (int)uVar55 < 0x11))) && (iVar6 != 1 || iVar44 != 1)) {
      if (((iVar4 == 1 &&
           (iVar8 == 1 &&
           ((iVar7 == 1 && iVar6 == 3) && (iVar44 == 3 && (iVar67 == 4 && iVar49 == 1))))) &&
           iVar5 == 1) ||
         ((iVar8 == 1 &&
          ((iVar7 == 1 && iVar6 == 3) && (iVar44 == 3 && (iVar67 == 4 && iVar49 == 1)))) &&
          (iVar5 == 2 && iVar4 == 2))) {
        uStackY_230 = 0x1524e6;
        convolution_transform_kernel_packed_sse
                  (&(local_218->super_Convolution).weight_data,&local_218->weight_data_tm,iVar66,
                   uVar55,iVar44,iVar6,iVar49,iVar67);
      }
      else {
        convolution_transform_kernel_packed
                  (&(local_218->super_Convolution).weight_data,&local_218->weight_data_tm,iVar66,
                   uVar55,iVar44,iVar6);
      }
      pCVar34 = local_218;
      if (local_210->lightmode != true) {
        return 0;
      }
      piVar12 = (local_218->super_Convolution).weight_data.refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          pvVar13 = (local_218->super_Convolution).weight_data.data;
          pAVar14 = (local_218->super_Convolution).weight_data.allocator;
          if (pAVar14 == (Allocator *)0x0) {
            if (pvVar13 != (void *)0x0) {
              free(pvVar13);
            }
          }
          else {
            (*pAVar14->_vptr_Allocator[3])();
          }
        }
      }
      (pCVar34->super_Convolution).weight_data.cstep = 0;
      *(undefined1 (*) [16])((long)&(pCVar34->super_Convolution).weight_data.refcount + 4) =
           (undefined1  [16])0x0;
      (pCVar34->super_Convolution).weight_data.data = (void *)0x0;
      (pCVar34->super_Convolution).weight_data.refcount = (int *)0x0;
      (pCVar34->super_Convolution).weight_data.dims = 0;
      (pCVar34->super_Convolution).weight_data.w = 0;
      (pCVar34->super_Convolution).weight_data.h = 0;
      (pCVar34->super_Convolution).weight_data.d = 0;
      (pCVar34->super_Convolution).weight_data.c = 0;
      return 0;
    }
    local_d8 = &(local_218->super_Convolution).weight_data;
    uVar64 = iVar6 * iVar44;
    iVar49 = uVar64 * iVar66;
    uStackY_230 = 0x1520d3;
    convolution_im2col_gemm_get_optimal_tile_mnk
              (uVar55,0,iVar49,&TILE_M,&TILE_N,&TILE_K,local_210->num_threads);
    uVar48 = (long)(int)(TILE_M + uVar55 + -1) / (long)TILE_M;
    uVar47 = uVar48 & 0xffffffff;
    local_160 = 1;
    if ((uVar61 & 3) == 0) {
      local_160 = (ulong)pOVar50->use_packing_layout * 3 + 1;
    }
    local_1b8 = 0;
    pd._vptr_ParamDict = (_func_int **)0x0;
    pd.d._0_4_ = 0;
    pd.d._4_4_ = 0;
    local_1d8 = (Allocator *)0x0;
    iStack_1d0 = 0;
    iStack_1cc = 0;
    uStack_1c8._0_4_ = 0;
    uStack_1c8._4_4_ = 0;
    local_1c0[0] = 0;
    if (uVar64 == 1) {
      Mat::reshape((Mat *)&pd_5,local_d8,iVar49,uVar55,(Allocator *)0x0);
      this = local_218;
      piVar12 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      pd._vptr_ParamDict = pd_5._vptr_ParamDict;
      pd.d._0_4_ = pd_5.d._0_4_;
      pd.d._4_4_ = pd_5.d._4_4_;
      local_1d8 = local_128;
      iStack_1d0 = local_120._0_4_;
      uStack_1c8._0_4_ = local_120._8_4_;
      uStack_1c8._4_4_ = local_120._12_4_;
      local_1c0[0] = local_110;
      local_1b8 = local_108;
      iStack_1cc = iStack_11c;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_128 == (Allocator *)0x0) {
            if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
              free(pd_5._vptr_ParamDict);
            }
          }
          else {
            (*local_128->_vptr_Allocator[3])();
          }
        }
      }
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
    }
    else {
      Mat::reshape((Mat *)&pd_5,local_d8,uVar64,iVar66,uVar55,(Allocator *)0x0);
      local_158 = CONCAT44(local_158._4_4_,(int)uVar48);
      Mat::create((Mat *)&pd,iVar49,uVar55,4,(Allocator *)0x0);
      this = local_218;
      if (0 < (int)uVar55) {
        local_168 = pd._vptr_ParamDict;
        local_150 = 0;
        uVar61 = local_160 & 0xffffffff;
        uVar48 = 0;
        do {
          if ((int)local_160 <= iVar66) {
            pp_Var40 = (_func_int **)(local_138 * local_108 * uVar48 + (long)pd_5._vptr_ParamDict);
            lVar51 = 0;
            pp_Var59 = pd._vptr_ParamDict;
            do {
              if (0 < (int)uVar64) {
                uVar53 = 0;
                uVar47 = uVar61;
                pp_Var63 = pp_Var40;
                pp_Var62 = pp_Var40;
                do {
                  do {
                    *(undefined4 *)pp_Var59 = *(undefined4 *)pp_Var63;
                    pp_Var59 = (_func_int **)((long)pp_Var59 + 4);
                    uVar47 = uVar47 - 1;
                    pp_Var63 = (_func_int **)((long)pp_Var63 + (long)iStack_11c * local_138);
                  } while (uVar47 != 0);
                  uVar53 = uVar53 + 1;
                  pp_Var63 = (_func_int **)((long)pp_Var62 + 4);
                  uVar47 = uVar61;
                  pp_Var62 = pp_Var63;
                } while (uVar53 != uVar64);
              }
              lVar51 = lVar51 + uVar61;
              pp_Var40 = (_func_int **)((long)pp_Var40 + (long)iStack_11c * local_138 * uVar61);
            } while (lVar51 < (long)((long)iVar66 - (ulong)((int)local_160 - 1)));
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != local_208);
      }
      piVar12 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      uVar47 = local_158 & 0xffffffff;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_128 == (Allocator *)0x0) {
            if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
              free(pd_5._vptr_ParamDict);
            }
          }
          else {
            (*local_128->_vptr_Allocator[3])();
          }
        }
      }
    }
    lVar51 = (long)TILE_K;
    local_c0 = (long)TILE_M;
    Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,(TILE_K + iVar49 + -1) / TILE_K,
                ((int)local_208 + -1 + TILE_M) / TILE_M,4,(Allocator *)0x0);
    pMVar56 = local_d8;
    if (0 < (int)uVar47) {
      local_58 = (long)iVar49;
      local_60 = lVar51 * 4;
      local_70 = local_c0 * 4;
      local_90 = 4;
      local_98 = 8;
      local_a0 = 0xc;
      local_a8 = 1;
      local_b0 = 0;
      local_b8 = 0;
      uVar61 = 0;
      do {
        local_160 = uVar61 * local_c0;
        local_1fc = (int)local_208 - (int)local_160;
        if ((int)(uint)local_c0 < (int)local_1fc) {
          local_1fc = (uint)local_c0;
        }
        if (0 < iVar49) {
          local_78 = (ulong)local_1fc;
          local_48 = (long)(int)local_1fc;
          local_f0 = 0;
          uVar48 = 0;
          iVar67 = iVar49;
          do {
            local_cc = iVar67;
            local_158 = uVar48;
            iVar67 = local_cc;
            if (TILE_K < local_cc) {
              iVar67 = TILE_K;
            }
            local_150 = CONCAT44(local_150._4_4_,iVar67);
            uVar55 = iVar49 - (int)local_158;
            if (TILE_K < (int)uVar55) {
              uVar55 = TILE_K;
            }
            sVar15 = (this->weight_sgemm_data).elemsize;
            pauVar58 = (undefined1 (*) [16])
                       ((long)(this->weight_sgemm_data).data +
                       (long)(this->weight_sgemm_data).w * sVar15 *
                       (long)(int)((long)((ulong)(uint)((int)local_158 >> 0x1f) << 0x20 |
                                         local_158 & 0xffffffff) / (long)TILE_K) +
                       (this->weight_sgemm_data).cstep * uVar61 * sVar15);
            uVar48 = 0;
            local_168 = (_func_int **)(long)iStack_1cc;
            if (3 < (int)local_1fc) {
              local_c8 = uVar55 & 0xfffffffc;
              lVar52 = local_b8 * (long)local_168 + local_f0;
              local_40 = (long)local_168 * 0x10;
              lVar70 = local_90 * (long)local_168 + local_f0;
              lVar65 = local_98 * (long)local_168 + local_f0;
              lVar60 = local_a0 * (long)local_168 + local_f0;
              uVar53 = 0;
              do {
                if ((int)uVar55 < 4) {
                  uVar64 = 0;
                  lVar69 = local_158 * 4 + (uVar53 + local_160) * (long)local_168 * 4;
                  lVar32 = local_158 * 4 + (uVar53 + local_160 + 1) * (long)local_168 * 4;
                  lVar33 = local_158 * 4 + (uVar53 + local_160 + 2) * (long)local_168 * 4;
                  lVar45 = local_158 * 4 + (uVar53 + local_160 + 3) * (long)local_168 * 4;
                  local_50 = lVar52;
                }
                else {
                  iVar66 = 3;
                  lVar45 = 0;
                  pauVar57 = pauVar58;
                  do {
                    pauVar54 = pauVar57;
                    puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar45 + lVar52);
                    uVar43 = puVar1[1];
                    puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar45 + lVar70);
                    uVar18 = *puVar2;
                    uVar19 = puVar2[1];
                    puVar3 = (undefined4 *)((long)pd._vptr_ParamDict + lVar45 + lVar65);
                    uVar20 = *puVar3;
                    uVar21 = puVar3[1];
                    uVar22 = puVar3[2];
                    uVar23 = puVar3[3];
                    puVar3 = (undefined4 *)((long)pd._vptr_ParamDict + lVar45 + lVar60);
                    uVar24 = *puVar3;
                    uVar25 = puVar3[1];
                    uVar26 = puVar3[2];
                    uVar27 = puVar3[3];
                    auVar72._0_8_ = CONCAT44(puVar2[2],puVar1[2]);
                    auVar72._8_4_ = puVar1[3];
                    auVar72._12_4_ = puVar2[3];
                    pauVar57 = (undefined1 (*) [16])(pauVar58[4] + lVar45 * 4);
                    *(undefined4 *)pauVar57[-4] = *puVar1;
                    *(undefined4 *)(pauVar57[-4] + 4) = uVar18;
                    *(undefined4 *)(pauVar57[-4] + 8) = uVar20;
                    *(undefined4 *)(pauVar57[-4] + 0xc) = uVar24;
                    *(undefined4 *)pauVar57[-3] = uVar43;
                    *(undefined4 *)(pauVar57[-3] + 4) = uVar19;
                    *(undefined4 *)(pauVar57[-3] + 8) = uVar21;
                    *(undefined4 *)(pauVar57[-3] + 0xc) = uVar25;
                    auVar17._8_4_ = uVar22;
                    auVar17._0_8_ = auVar72._0_8_;
                    auVar17._12_4_ = uVar26;
                    pauVar57[-2] = auVar17;
                    auVar16._8_4_ = uVar23;
                    auVar16._0_8_ = auVar72._8_8_;
                    auVar16._12_4_ = uVar27;
                    pauVar57[-1] = auVar16;
                    lVar45 = lVar45 + 0x10;
                    iVar66 = iVar66 + 4;
                  } while (iVar66 < (int)uVar55);
                  pauVar58 = pauVar54 + 4;
                  lVar69 = lVar45 + lVar52;
                  lVar32 = lVar45 + lVar70;
                  lVar33 = lVar45 + lVar65;
                  lVar45 = lVar45 + lVar60;
                  uVar64 = local_c8;
                }
                if ((int)uVar64 < (int)uVar55) {
                  lVar46 = 0;
                  do {
                    *(undefined4 *)*pauVar58 =
                         *(undefined4 *)((long)pd._vptr_ParamDict + lVar46 * 4 + lVar69);
                    *(undefined4 *)(*pauVar58 + 4) =
                         *(undefined4 *)((long)pd._vptr_ParamDict + lVar46 * 4 + lVar32);
                    *(undefined4 *)(*pauVar58 + 8) =
                         *(undefined4 *)((long)pd._vptr_ParamDict + lVar46 * 4 + lVar33);
                    *(undefined4 *)(*pauVar58 + 0xc) =
                         *(undefined4 *)((long)pd._vptr_ParamDict + lVar46 * 4 + lVar45);
                    pauVar58 = pauVar58 + 1;
                    lVar46 = lVar46 + 1;
                  } while (iVar67 - uVar64 != (int)lVar46);
                }
                uVar48 = uVar53 + 4;
                uVar68 = uVar53 + 7;
                lVar52 = lVar52 + local_40;
                lVar70 = lVar70 + local_40;
                lVar65 = lVar65 + local_40;
                lVar60 = lVar60 + local_40;
                this = local_218;
                uVar53 = uVar48;
              } while (uVar68 < local_78);
            }
            if ((int)((uint)uVar48 | 1) < (int)local_1fc) {
              uVar53 = uVar48 & 0xffffffff;
              lVar52 = local_f0 + (local_a8 + uVar53) * (long)local_168 * 4;
              lVar60 = local_f0 + (local_b0 + uVar53) * (long)local_168 * 4;
              do {
                if ((int)uVar55 < 4) {
                  uVar64 = 0;
                  lVar70 = local_158 * 4 + (uVar53 + local_160) * (long)local_168 * 4;
                  lVar65 = local_158 * 4 + (local_160 + uVar53 + 1) * (long)local_168 * 4;
                }
                else {
                  iVar66 = 3;
                  lVar70 = 0;
                  pauVar57 = pauVar58;
                  do {
                    pauVar54 = pauVar57;
                    puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar70 + lVar60);
                    uVar19 = puVar1[1];
                    puVar2 = (undefined4 *)((long)pd._vptr_ParamDict + lVar70 + lVar52);
                    uVar43 = *puVar2;
                    uVar18 = puVar2[1];
                    auVar73._4_4_ = puVar2[2];
                    auVar73._0_4_ = puVar1[2];
                    auVar73._8_4_ = puVar1[3];
                    auVar73._12_4_ = puVar2[3];
                    puVar2 = (undefined4 *)(*pauVar58 + lVar70 * 2);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar43;
                    puVar2[2] = uVar19;
                    puVar2[3] = uVar18;
                    *(undefined1 (*) [16])(puVar2 + 4) = auVar73;
                    lVar70 = lVar70 + 0x10;
                    iVar66 = iVar66 + 4;
                    pauVar57 = (undefined1 (*) [16])(puVar2 + 8);
                  } while (iVar66 < (int)uVar55);
                  pauVar58 = pauVar54 + 2;
                  lVar65 = lVar70 + lVar52;
                  lVar70 = lVar70 + lVar60;
                  uVar64 = uVar55 & 0xfffffffc;
                }
                if ((int)uVar64 < (int)uVar55) {
                  lVar69 = 0;
                  do {
                    *(undefined4 *)*pauVar58 =
                         *(undefined4 *)((long)pd._vptr_ParamDict + lVar69 * 4 + lVar70);
                    *(undefined4 *)(*pauVar58 + 4) =
                         *(undefined4 *)((long)pd._vptr_ParamDict + lVar69 * 4 + lVar65);
                    pauVar58 = (undefined1 (*) [16])(*pauVar58 + 8);
                    lVar69 = lVar69 + 1;
                  } while (iVar67 - uVar64 != (int)lVar69);
                }
                uVar48 = uVar53 + 2;
                lVar65 = uVar53 + 3;
                lVar52 = lVar52 + (long)local_168 * 8;
                lVar60 = lVar60 + (long)local_168 * 8;
                uVar53 = uVar48;
              } while (lVar65 < local_48);
            }
            if ((int)uVar48 < (int)local_1fc) {
              uVar48 = uVar48 & 0xffffffff;
              do {
                pauVar57 = (undefined1 (*) [16])
                           ((long)pd._vptr_ParamDict +
                           local_158 * 4 + (local_160 + uVar48) * (long)local_168 * 4);
                uVar64 = 0;
                if (3 < (int)uVar55) {
                  iVar66 = 3;
                  do {
                    *pauVar58 = *pauVar57;
                    pauVar58 = pauVar58 + 1;
                    pauVar57 = pauVar57 + 1;
                    iVar66 = iVar66 + 4;
                    uVar64 = uVar55 & 0xfffffffc;
                  } while (iVar66 < (int)uVar55);
                }
                if ((int)uVar64 < (int)uVar55) {
                  lVar52 = 0;
                  do {
                    *(undefined4 *)*pauVar58 = *(undefined4 *)(*pauVar57 + lVar52 * 4);
                    pauVar58 = (undefined1 (*) [16])(*pauVar58 + 4);
                    lVar52 = lVar52 + 1;
                  } while (iVar67 - uVar64 != (int)lVar52);
                }
                uVar48 = uVar48 + 1;
              } while (uVar48 != local_78);
            }
            local_f0 = local_f0 + local_60;
            uVar48 = local_158 + lVar51;
            local_80 = uVar61;
            iVar67 = local_cc - TILE_K;
          } while ((long)(local_158 + lVar51) < local_58);
        }
        uVar61 = uVar61 + 1;
        local_b8 = local_b8 + local_70;
        local_90 = local_90 + local_70;
        local_98 = local_98 + local_70;
        local_a0 = local_a0 + local_70;
        local_a8 = local_a8 + local_c0;
        local_b0 = local_b0 + local_c0;
        local_88 = lVar51;
        local_68 = uVar47;
      } while (uVar61 != uVar47);
    }
    piVar12 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (local_1d8 == (Allocator *)0x0) {
          if (pd._vptr_ParamDict != (_func_int **)0x0) {
            free(pd._vptr_ParamDict);
          }
        }
        else {
          (*local_1d8->_vptr_Allocator[3])();
        }
      }
    }
    local_1b8 = 0;
    pd._vptr_ParamDict = (_func_int **)0x0;
    pd.d._0_4_ = 0;
    pd.d._4_4_ = 0;
    iStack_1d0 = 0;
    iStack_1cc = 0;
    uStack_1c8._0_4_ = 0;
    uStack_1c8._4_4_ = 0;
    local_1c0[0] = 0;
    if (local_210->lightmode != true) {
      return 0;
    }
    piVar12 = (this->super_Convolution).weight_data.refcount;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        pvVar13 = (this->super_Convolution).weight_data.data;
        pAVar14 = (this->super_Convolution).weight_data.allocator;
        if (pAVar14 == (Allocator *)0x0) {
          if (pvVar13 != (void *)0x0) {
            free(pvVar13);
          }
        }
        else {
          (*pAVar14->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&pMVar56->refcount + 4) = (undefined1  [16])0x0;
    pMVar56->data = (void *)0x0;
    pMVar56->refcount = (int *)0x0;
    goto LAB_00152f17;
  }
  pMVar10 = (this->super_Convolution).super_Layer.bottom_shapes.
            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((((pMVar10 ==
         (this->super_Convolution).super_Layer.bottom_shapes.
         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
         _M_finish) || (pMVar10->w == 0)) || (pMVar10->h == 0)) &&
     (((pMVar11 = (this->super_Convolution).super_Layer.top_shapes.
                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start,
       pMVar11 ==
       (this->super_Convolution).super_Layer.top_shapes.
       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
       _M_finish || (pMVar11->w == 0)) || (pMVar11->h == 0)))) {
    if ((((int)uVar55 < 0x21) && (local_210->use_winograd63_convolution != false)) &&
       (iVar66 < 0x21)) {
LAB_001521ce:
      pOVar50 = local_210;
      conv3x3s1_winograd63_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,iVar66,uVar55,
                 local_210);
    }
    else {
      pMVar56 = &(this->super_Convolution).weight_data;
      if (local_210->use_winograd43_convolution != true) goto LAB_001525cd;
LAB_001525b6:
      pOVar50 = local_210;
      conv3x3s1_winograd43_transform_kernel
                (pMVar56,&this->weight_winograd43_data,iVar66,uVar55,local_210);
    }
  }
  else {
    pMVar11 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((pMVar11 ==
          (this->super_Convolution).super_Layer.top_shapes.
          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
          _M_finish) || (iVar49 = pMVar11->w, iVar49 == 0)) || (iVar67 = pMVar11->h, iVar67 == 0)) {
      iVar49 = pMVar10->w;
      iVar67 = pMVar10->h;
      iVar44 = (local_218->super_Convolution).pad_left;
      if ((((iVar44 < 1) && (iVar6 = (local_218->super_Convolution).pad_right, iVar6 < 1)) &&
          (iVar7 = (local_218->super_Convolution).pad_top, iVar7 < 1)) &&
         (iVar8 = (local_218->super_Convolution).pad_bottom, iVar8 < 1)) {
        if ((iVar8 == -0xe9 && (iVar7 == -0xe9 && (iVar6 == -0xe9 && iVar44 == -0xe9))) ||
           (iVar8 == -0xea && (iVar7 == -0xea && (iVar6 == -0xea && iVar44 == -0xea))))
        goto LAB_00151dba;
      }
      else {
        iVar49 = iVar44 + iVar49 + (local_218->super_Convolution).pad_right;
        iVar67 = iVar67 + (local_218->super_Convolution).pad_top +
                 (local_218->super_Convolution).pad_bottom;
      }
    }
    else {
LAB_00151dba:
      iVar49 = iVar49 + 2;
      iVar67 = iVar67 + 2;
    }
    bVar35 = test_prefer_winograd63(iVar66,uVar55,iVar49,iVar67);
    bVar36 = test_prefer_winograd23(iVar66,uVar55,iVar49,iVar67);
    bVar42 = bVar36 & bVar41;
    if (!bVar36) {
      bVar41 = bVar35;
    }
    bVar37 = bVar35 & local_210->use_winograd63_convolution;
    bVar41 = (local_210->use_winograd63_convolution ^ 1U) & bVar35 | bVar41 ^ 1;
    if ((bVar41 == 1) && (local_210->use_winograd43_convolution == false)) {
      bVar37 = bVar37 | local_210->use_winograd63_convolution;
      bVar42 = bVar42 | local_210->use_winograd63_convolution ^ 1U;
      bVar41 = 0;
    }
    this = local_218;
    if (bVar42 == 0) {
      if (bVar41 != 0) {
        pMVar56 = &(local_218->super_Convolution).weight_data;
        goto LAB_001525b6;
      }
      pOVar50 = local_210;
      if ((bVar37 & 1) != 0) goto LAB_001521ce;
    }
    else {
      pMVar56 = &(local_218->super_Convolution).weight_data;
LAB_001525cd:
      pOVar50 = local_210;
      conv3x3s1_winograd23_transform_kernel
                (pMVar56,&this->weight_winograd23_data,iVar66,uVar55,local_210);
    }
  }
  if (pOVar50->lightmode != true) {
    return 0;
  }
  piVar12 = (this->super_Convolution).weight_data.refcount;
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      pvVar13 = (this->super_Convolution).weight_data.data;
      pAVar14 = (this->super_Convolution).weight_data.allocator;
      if (pAVar14 == (Allocator *)0x0) {
        if (pvVar13 != (void *)0x0) {
          free(pvVar13);
        }
      }
      else {
        (*pAVar14->_vptr_Allocator[3])();
      }
    }
  }
  (this->super_Convolution).weight_data.cstep = 0;
  *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
       (undefined1  [16])0x0;
  (this->super_Convolution).weight_data.data = (void *)0x0;
  (this->super_Convolution).weight_data.refcount = (int *)0x0;
LAB_00152f17:
  (this->super_Convolution).weight_data.dims = 0;
  (this->super_Convolution).weight_data.w = 0;
  (this->super_Convolution).weight_data.h = 0;
  (this->super_Convolution).weight_data.d = 0;
  (this->super_Convolution).weight_data.c = 0;
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}